

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__vertical_gather_with_8_coeffs
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float *pfVar138;
  float *pfVar139;
  float *pfVar140;
  long lVar141;
  float *pfVar142;
  float *pfVar143;
  float *pfVar144;
  float *pfVar145;
  float *pfVar146;
  long lVar147;
  
  pfVar138 = *inputs;
  pfVar142 = inputs[1];
  fVar10 = *vertical_coefficients;
  fVar11 = vertical_coefficients[1];
  pfVar143 = inputs[2];
  fVar12 = vertical_coefficients[2];
  pfVar144 = inputs[3];
  fVar13 = vertical_coefficients[3];
  pfVar145 = inputs[4];
  fVar14 = vertical_coefficients[4];
  pfVar140 = inputs[5];
  fVar15 = vertical_coefficients[5];
  pfVar146 = inputs[6];
  fVar16 = vertical_coefficients[6];
  pfVar139 = inputs[7];
  fVar17 = vertical_coefficients[7];
  lVar147 = (long)input0_end - (long)pfVar138;
  if (0x3f < lVar147) {
    lVar141 = 0;
    do {
      pfVar1 = (float *)((long)pfVar138 + lVar141);
      fVar18 = pfVar1[1];
      fVar19 = pfVar1[2];
      fVar20 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar138 + lVar141 + 0x10);
      fVar21 = *pfVar2;
      fVar22 = pfVar2[1];
      fVar23 = pfVar2[2];
      fVar24 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar138 + lVar141 + 0x20);
      fVar25 = *pfVar2;
      fVar26 = pfVar2[1];
      fVar27 = pfVar2[2];
      fVar28 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar138 + lVar141 + 0x30);
      fVar29 = *pfVar2;
      fVar30 = pfVar2[1];
      fVar31 = pfVar2[2];
      fVar32 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar142 + lVar141);
      fVar33 = pfVar2[1];
      fVar34 = pfVar2[2];
      fVar35 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar142 + lVar141 + 0x10);
      fVar36 = *pfVar3;
      fVar37 = pfVar3[1];
      fVar38 = pfVar3[2];
      fVar39 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar142 + lVar141 + 0x20);
      fVar40 = *pfVar3;
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar142 + lVar141 + 0x30);
      fVar44 = *pfVar3;
      fVar45 = pfVar3[1];
      fVar46 = pfVar3[2];
      fVar47 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar143 + lVar141);
      fVar48 = pfVar3[1];
      fVar49 = pfVar3[2];
      fVar50 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar143 + lVar141 + 0x10);
      fVar51 = *pfVar4;
      fVar52 = pfVar4[1];
      fVar53 = pfVar4[2];
      fVar54 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar143 + lVar141 + 0x20);
      fVar55 = *pfVar4;
      fVar56 = pfVar4[1];
      fVar57 = pfVar4[2];
      fVar58 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar143 + lVar141 + 0x30);
      fVar59 = *pfVar4;
      fVar60 = pfVar4[1];
      fVar61 = pfVar4[2];
      fVar62 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar144 + lVar141);
      fVar63 = pfVar4[1];
      fVar64 = pfVar4[2];
      fVar65 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar144 + lVar141 + 0x10);
      fVar66 = *pfVar5;
      fVar67 = pfVar5[1];
      fVar68 = pfVar5[2];
      fVar69 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar144 + lVar141 + 0x20);
      fVar70 = *pfVar5;
      fVar71 = pfVar5[1];
      fVar72 = pfVar5[2];
      fVar73 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar144 + lVar141 + 0x30);
      fVar74 = *pfVar5;
      fVar75 = pfVar5[1];
      fVar76 = pfVar5[2];
      fVar77 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar145 + lVar141);
      fVar78 = pfVar5[1];
      fVar79 = pfVar5[2];
      fVar80 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar145 + lVar141 + 0x10);
      fVar81 = *pfVar6;
      fVar82 = pfVar6[1];
      fVar83 = pfVar6[2];
      fVar84 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar145 + lVar141 + 0x20);
      fVar85 = *pfVar6;
      fVar86 = pfVar6[1];
      fVar87 = pfVar6[2];
      fVar88 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar145 + lVar141 + 0x30);
      fVar89 = *pfVar6;
      fVar90 = pfVar6[1];
      fVar91 = pfVar6[2];
      fVar92 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar140 + lVar141);
      fVar93 = pfVar6[1];
      fVar94 = pfVar6[2];
      fVar95 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar140 + lVar141 + 0x10);
      fVar96 = *pfVar7;
      fVar97 = pfVar7[1];
      fVar98 = pfVar7[2];
      fVar99 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar140 + lVar141 + 0x20);
      fVar100 = *pfVar7;
      fVar101 = pfVar7[1];
      fVar102 = pfVar7[2];
      fVar103 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar140 + lVar141 + 0x30);
      fVar104 = *pfVar7;
      fVar105 = pfVar7[1];
      fVar106 = pfVar7[2];
      fVar107 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar146 + lVar141);
      fVar108 = pfVar7[1];
      fVar109 = pfVar7[2];
      fVar110 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar146 + lVar141 + 0x10);
      fVar111 = *pfVar8;
      fVar112 = pfVar8[1];
      fVar113 = pfVar8[2];
      fVar114 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar146 + lVar141 + 0x20);
      fVar115 = *pfVar8;
      fVar116 = pfVar8[1];
      fVar117 = pfVar8[2];
      fVar118 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar146 + lVar141 + 0x30);
      fVar119 = *pfVar8;
      fVar120 = pfVar8[1];
      fVar121 = pfVar8[2];
      fVar122 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar139 + lVar141);
      fVar123 = pfVar8[1];
      fVar124 = pfVar8[2];
      fVar125 = pfVar8[3];
      pfVar9 = (float *)((long)pfVar139 + lVar141 + 0x10);
      fVar126 = *pfVar9;
      fVar127 = pfVar9[1];
      fVar128 = pfVar9[2];
      fVar129 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar139 + lVar141 + 0x20);
      fVar130 = *pfVar9;
      fVar131 = pfVar9[1];
      fVar132 = pfVar9[2];
      fVar133 = pfVar9[3];
      pfVar9 = (float *)((long)pfVar139 + lVar141 + 0x30);
      fVar134 = *pfVar9;
      fVar135 = pfVar9[1];
      fVar136 = pfVar9[2];
      fVar137 = pfVar9[3];
      pfVar9 = (float *)((long)outputp + lVar141);
      *pfVar9 = *pfVar8 * fVar17 +
                *pfVar7 * fVar16 +
                *pfVar6 * fVar15 +
                *pfVar5 * fVar14 +
                *pfVar4 * fVar13 + *pfVar3 * fVar12 + *pfVar2 * fVar11 + *pfVar1 * fVar10;
      pfVar9[1] = fVar123 * fVar17 +
                  fVar108 * fVar16 +
                  fVar93 * fVar15 +
                  fVar78 * fVar14 +
                  fVar63 * fVar13 + fVar48 * fVar12 + fVar33 * fVar11 + fVar18 * fVar10;
      pfVar9[2] = fVar124 * fVar17 +
                  fVar109 * fVar16 +
                  fVar94 * fVar15 +
                  fVar79 * fVar14 +
                  fVar64 * fVar13 + fVar49 * fVar12 + fVar34 * fVar11 + fVar19 * fVar10;
      pfVar9[3] = fVar125 * fVar17 +
                  fVar110 * fVar16 +
                  fVar95 * fVar15 +
                  fVar80 * fVar14 +
                  fVar65 * fVar13 + fVar50 * fVar12 + fVar35 * fVar11 + fVar20 * fVar10;
      pfVar1 = (float *)((long)outputp + lVar141 + 0x10);
      *pfVar1 = fVar126 * fVar17 +
                fVar111 * fVar16 +
                fVar96 * fVar15 +
                fVar81 * fVar14 +
                fVar66 * fVar13 + fVar51 * fVar12 + fVar36 * fVar11 + fVar21 * fVar10;
      pfVar1[1] = fVar127 * fVar17 +
                  fVar112 * fVar16 +
                  fVar97 * fVar15 +
                  fVar82 * fVar14 +
                  fVar67 * fVar13 + fVar52 * fVar12 + fVar37 * fVar11 + fVar22 * fVar10;
      pfVar1[2] = fVar128 * fVar17 +
                  fVar113 * fVar16 +
                  fVar98 * fVar15 +
                  fVar83 * fVar14 +
                  fVar68 * fVar13 + fVar53 * fVar12 + fVar38 * fVar11 + fVar23 * fVar10;
      pfVar1[3] = fVar129 * fVar17 +
                  fVar114 * fVar16 +
                  fVar99 * fVar15 +
                  fVar84 * fVar14 +
                  fVar69 * fVar13 + fVar54 * fVar12 + fVar39 * fVar11 + fVar24 * fVar10;
      pfVar1 = (float *)((long)outputp + lVar141 + 0x20);
      *pfVar1 = fVar130 * fVar17 +
                fVar115 * fVar16 +
                fVar100 * fVar15 +
                fVar85 * fVar14 +
                fVar70 * fVar13 + fVar55 * fVar12 + fVar40 * fVar11 + fVar25 * fVar10;
      pfVar1[1] = fVar131 * fVar17 +
                  fVar116 * fVar16 +
                  fVar101 * fVar15 +
                  fVar86 * fVar14 +
                  fVar71 * fVar13 + fVar56 * fVar12 + fVar41 * fVar11 + fVar26 * fVar10;
      pfVar1[2] = fVar132 * fVar17 +
                  fVar117 * fVar16 +
                  fVar102 * fVar15 +
                  fVar87 * fVar14 +
                  fVar72 * fVar13 + fVar57 * fVar12 + fVar42 * fVar11 + fVar27 * fVar10;
      pfVar1[3] = fVar133 * fVar17 +
                  fVar118 * fVar16 +
                  fVar103 * fVar15 +
                  fVar88 * fVar14 +
                  fVar73 * fVar13 + fVar58 * fVar12 + fVar43 * fVar11 + fVar28 * fVar10;
      pfVar1 = (float *)((long)outputp + lVar141 + 0x30);
      *pfVar1 = fVar134 * fVar17 +
                fVar119 * fVar16 +
                fVar104 * fVar15 +
                fVar89 * fVar14 +
                fVar74 * fVar13 + fVar59 * fVar12 + fVar44 * fVar11 + fVar29 * fVar10;
      pfVar1[1] = fVar135 * fVar17 +
                  fVar120 * fVar16 +
                  fVar105 * fVar15 +
                  fVar90 * fVar14 +
                  fVar75 * fVar13 + fVar60 * fVar12 + fVar45 * fVar11 + fVar30 * fVar10;
      pfVar1[2] = fVar136 * fVar17 +
                  fVar121 * fVar16 +
                  fVar106 * fVar15 +
                  fVar91 * fVar14 +
                  fVar76 * fVar13 + fVar61 * fVar12 + fVar46 * fVar11 + fVar31 * fVar10;
      pfVar1[3] = fVar137 * fVar17 +
                  fVar122 * fVar16 +
                  fVar107 * fVar15 +
                  fVar92 * fVar14 +
                  fVar77 * fVar13 + fVar62 * fVar12 + fVar47 * fVar11 + fVar32 * fVar10;
      lVar141 = lVar141 + 0x40;
      lVar147 = lVar147 + -0x40;
    } while (0x3f < lVar147);
    outputp = (float *)((long)outputp + lVar141);
    pfVar138 = (float *)((long)pfVar138 + lVar141);
    pfVar142 = (float *)((long)pfVar142 + lVar141);
    pfVar143 = (float *)((long)pfVar143 + lVar141);
    pfVar144 = (float *)((long)pfVar144 + lVar141);
    pfVar145 = (float *)((long)pfVar145 + lVar141);
    pfVar140 = (float *)((long)pfVar140 + lVar141);
    pfVar146 = (float *)((long)pfVar146 + lVar141);
    pfVar139 = (float *)((long)pfVar139 + lVar141);
  }
  lVar147 = (long)input0_end - (long)pfVar138;
  if (0xf < lVar147) {
    lVar141 = 0;
    do {
      pfVar1 = (float *)((long)pfVar138 + lVar141);
      fVar18 = pfVar1[1];
      fVar19 = pfVar1[2];
      fVar20 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar142 + lVar141);
      fVar21 = pfVar2[1];
      fVar22 = pfVar2[2];
      fVar23 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar143 + lVar141);
      fVar24 = pfVar3[1];
      fVar25 = pfVar3[2];
      fVar26 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar144 + lVar141);
      fVar27 = pfVar4[1];
      fVar28 = pfVar4[2];
      fVar29 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar145 + lVar141);
      fVar30 = pfVar5[1];
      fVar31 = pfVar5[2];
      fVar32 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar140 + lVar141);
      fVar33 = pfVar6[1];
      fVar34 = pfVar6[2];
      fVar35 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar146 + lVar141);
      fVar36 = pfVar7[1];
      fVar37 = pfVar7[2];
      fVar38 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar139 + lVar141);
      fVar39 = pfVar8[1];
      fVar40 = pfVar8[2];
      fVar41 = pfVar8[3];
      pfVar9 = (float *)((long)outputp + lVar141);
      *pfVar9 = *pfVar8 * fVar17 +
                *pfVar7 * fVar16 +
                *pfVar6 * fVar15 +
                *pfVar5 * fVar14 +
                *pfVar4 * fVar13 + *pfVar3 * fVar12 + *pfVar2 * fVar11 + *pfVar1 * fVar10;
      pfVar9[1] = fVar39 * fVar17 +
                  fVar36 * fVar16 +
                  fVar33 * fVar15 +
                  fVar30 * fVar14 +
                  fVar27 * fVar13 + fVar24 * fVar12 + fVar21 * fVar11 + fVar18 * fVar10;
      pfVar9[2] = fVar40 * fVar17 +
                  fVar37 * fVar16 +
                  fVar34 * fVar15 +
                  fVar31 * fVar14 +
                  fVar28 * fVar13 + fVar25 * fVar12 + fVar22 * fVar11 + fVar19 * fVar10;
      pfVar9[3] = fVar41 * fVar17 +
                  fVar38 * fVar16 +
                  fVar35 * fVar15 +
                  fVar32 * fVar14 +
                  fVar29 * fVar13 + fVar26 * fVar12 + fVar23 * fVar11 + fVar20 * fVar10;
      lVar141 = lVar141 + 0x10;
      lVar147 = lVar147 + -0x10;
    } while (0xf < lVar147);
    outputp = (float *)((long)outputp + lVar141);
    pfVar138 = (float *)((long)pfVar138 + lVar141);
    pfVar142 = (float *)((long)pfVar142 + lVar141);
    pfVar143 = (float *)((long)pfVar143 + lVar141);
    pfVar144 = (float *)((long)pfVar144 + lVar141);
    pfVar145 = (float *)((long)pfVar145 + lVar141);
    pfVar140 = (float *)((long)pfVar140 + lVar141);
    pfVar146 = (float *)((long)pfVar146 + lVar141);
    pfVar139 = (float *)((long)pfVar139 + lVar141);
  }
  if (pfVar138 < input0_end) {
    lVar147 = 0;
    do {
      pfVar1 = (float *)((long)pfVar138 + lVar147);
      *(float *)((long)outputp + lVar147) =
           *(float *)((long)pfVar139 + lVar147) * fVar17 +
           *(float *)((long)pfVar146 + lVar147) * fVar16 +
           *(float *)((long)pfVar140 + lVar147) * fVar15 +
           *(float *)((long)pfVar145 + lVar147) * fVar14 +
           *(float *)((long)pfVar144 + lVar147) * fVar13 +
           *(float *)((long)pfVar143 + lVar147) * fVar12 +
           *(float *)((long)pfVar142 + lVar147) * fVar11 + *pfVar1 * fVar10;
      lVar147 = lVar147 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}